

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  N_Vector p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  N_Vector x;
  undefined4 in_register_00000014;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *module;
  char *module_00;
  char *module_01;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *module_02;
  char *module_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *module_04;
  char *module_05;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *module_06;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *module_07;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *module_08;
  char *module_09;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *module_10;
  char *extraout_RDX_32;
  char *extraout_RDX_33;
  char *module_11;
  char *extraout_RDX_34;
  char *extraout_RDX_35;
  char *extraout_RDX_36;
  char *extraout_RDX_37;
  char *module_12;
  char *module_13;
  char *extraout_RDX_38;
  ulong uVar10;
  undefined8 uVar11;
  KINMem pKVar12;
  char *pcVar13;
  uint uVar14;
  bool bVar15;
  double dVar16;
  sunrealtype sVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  sunrealtype *R;
  double local_100;
  double local_f8;
  double local_e8;
  double local_d8;
  double local_c0;
  undefined8 local_a8;
  double local_98;
  
  if (kinmem == (void *)0x0) {
    pcVar9 = "KINSol";
    pcVar13 = "kinsol_mem = NULL illegal.";
    uVar8 = 0xffffffff;
    kinmem = (KINMem)0x0;
    iVar5 = 0x1f0;
  }
  else if (*(int *)((long)kinmem + 0x298) == 0) {
    pcVar9 = "KINSol";
    pcVar13 = "Attempt to call before KINMalloc illegal.";
    uVar8 = 0xfffffffd;
    iVar5 = 0x1f9;
  }
  else {
    *(N_Vector *)((long)kinmem + 0x108) = u;
    *(N_Vector *)((long)kinmem + 0x128) = u_scale;
    *(N_Vector *)((long)kinmem + 0x130) = f_scale;
    *(int *)((long)kinmem + 0x30) = strategy_in;
    if (strategy_in == 3) {
      if (u == (N_Vector)0x0) {
        pcVar9 = "KINSol";
        pcVar13 = "uu = NULL illegal.";
        uVar8 = 0xfffffffe;
        iVar5 = 0x20d;
      }
      else if (*(int *)((long)kinmem + 0x60) == 0) {
        pKVar12 = (KINMem)kinmem;
        KINPrintInfo((KINMem)kinmem,3,(char *)CONCAT44(in_register_00000014,strategy_in),
                     (char *)u_scale,"scsteptol = %12.3lg  fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28),*(undefined8 *)((long)kinmem + 0x20));
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        p_Var1 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        uVar10 = 0xfffffc19;
        pcVar9 = extraout_RDX_00;
        while (iVar5 = (int)uVar10, iVar5 == -999) {
          *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
          pKVar12 = *(KINMem *)((long)kinmem + 0x108);
          iVar5 = (**(code **)((long)kinmem + 0x10))
                            (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          if (iVar5 < 0) {
            KINPrintInfo(pKVar12,1,module,(char *)u_scale,"Return value: %d",0xfffffffffffffff3);
            goto LAB_0010a18e;
          }
          if (*(long *)((long)kinmem + 0x1c0) == 0) {
LAB_00109fdb:
            if (*(int *)((long)kinmem + 0x164) == 0) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x110));
              dVar16 = 1.0;
            }
            else {
              N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x110));
LAB_0010a01a:
              dVar16 = *(double *)((long)kinmem + 0x168);
            }
          }
          else {
            lVar7 = *(long *)((long)kinmem + 0xd0);
            uVar10 = *(ulong *)((long)kinmem + 0x1c8);
            if (lVar7 <= (long)uVar10) goto LAB_00109fdb;
            if ((long)uVar10 < 1) {
              uVar10 = 0;
            }
            u_scale = *(N_Vector *)((long)kinmem + 0x110);
            AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),p_Var1,u_scale,
                        *(N_Vector *)((long)kinmem + 0x108),~uVar10 + lVar7,
                        *(sunrealtype **)((long)kinmem + 0x1a8),
                        *(sunrealtype **)((long)kinmem + 0x1a0));
            dVar16 = 1.0;
            if ((~uVar10 + lVar7 == 0) && (dVar16 = 1.0, *(int *)((long)kinmem + 0x1e8) != 0))
            goto LAB_0010a01a;
          }
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                       *(undefined8 *)((long)kinmem + 0x108),p_Var1);
          pKVar12 = (KINMem)kinmem;
          sVar17 = KINScFNorm((KINMem)kinmem,p_Var1,*(N_Vector *)((long)kinmem + 0x130));
          *(sunrealtype *)((long)kinmem + 0x250) = sVar17;
          KINPrintInfo(pKVar12,4,module_00,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg")
          ;
          KINPrintInfo(pKVar12,2,module_01,(char *)u_scale,
                       "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),
                       *(undefined8 *)((long)kinmem + 0xd8));
          uVar10 = 0xfffffffa;
          if (*(long *)((long)kinmem + 0xd0) < *(long *)((long)kinmem + 0x38)) {
            uVar10 = 0xfffffc19;
          }
          bVar15 = dVar16 * *(double *)((long)kinmem + 0x20) < *(double *)((long)kinmem + 0x250);
          u_scale = (N_Vector)CONCAT71((int7)((ulong)u_scale >> 8),bVar15);
          if (!bVar15) {
            uVar10 = 0;
          }
          if ((bVar15 && *(long *)((long)kinmem + 0xd0) < *(long *)((long)kinmem + 0x38)) ||
             (pcVar9 = extraout_RDX_01, *(int *)((long)kinmem + 0x160) != 0)) {
            pKVar12 = *(KINMem *)((long)kinmem + 0x110);
            N_VScale(0x3ff0000000000000,pKVar12,*(undefined8 *)((long)kinmem + 0x108));
            pcVar9 = extraout_RDX_02;
          }
        }
        KINPrintInfo(pKVar12,1,pcVar9,(char *)u_scale,"Return value: %d",uVar10);
        if (iVar5 == -6) {
          pcVar9 = "The maximum number of iterations was reached before convergence.";
          uVar8 = 0xfffffffa;
          iVar5 = 0x22b;
          goto LAB_0010a1fb;
        }
        if (iVar5 != -0xd) {
          return iVar5;
        }
LAB_0010a18e:
        pcVar9 = "KINSol";
        pcVar13 = "The system function failed in an unrecoverable manner.";
        uVar8 = 0xfffffff3;
        iVar5 = 0x227;
      }
      else {
        pcVar9 = "KINSol";
        pcVar13 = "Constraints not allowed with fixed point or Picard iterations";
        uVar8 = 0xfffffffe;
        iVar5 = 0x215;
      }
    }
    else if (u == (N_Vector)0x0) {
      pcVar9 = "KINSolInit";
      pcVar13 = "uu = NULL illegal.";
      uVar8 = 0xfffffffe;
      iVar5 = 0x59d;
    }
    else if ((uint)strategy_in < 4) {
      if (u_scale == (N_Vector)0x0) {
        pcVar9 = "KINSolInit";
        pcVar13 = "uscale = NULL illegal.";
        uVar8 = 0xfffffffe;
        iVar5 = 0x5b0;
      }
      else {
        dVar16 = (double)N_VMin(u_scale);
        if (dVar16 <= 0.0) {
          pcVar9 = "KINSolInit";
          pcVar13 = "uscale has nonpositive elements.";
          uVar8 = 0xfffffffe;
          iVar5 = 0x5b7;
        }
        else if (*(long *)((long)kinmem + 0x130) == 0) {
          pcVar9 = "KINSolInit";
          pcVar13 = "fscale = NULL illegal.";
          uVar8 = 0xfffffffe;
          iVar5 = 0x5be;
        }
        else {
          dVar16 = (double)N_VMin();
          if (dVar16 <= 0.0) {
            pcVar9 = "KINSolInit";
            pcVar13 = "fscale has nonpositive elements.";
            uVar8 = 0xfffffffe;
            iVar5 = 0x5c5;
          }
          else {
            pKVar12 = *(KINMem *)((long)kinmem + 0x140);
            if (pKVar12 == (KINMem)0x0) {
              *(undefined4 *)((long)kinmem + 0x60) = 0;
              pcVar9 = extraout_RDX;
LAB_0010a26b:
              KINPrintInfo(pKVar12,3,pcVar9,(char *)u_scale,
                           "scsteptol = %12.3lg  fnormtol = %12.3lg",
                           *(undefined8 *)((long)kinmem + 0x28));
              dVar16 = *(double *)((long)kinmem + 0x80);
              if ((dVar16 == 0.0) && (!NAN(dVar16))) {
                dVar16 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x108),
                                            *(undefined8 *)((long)kinmem + 0x128));
                dVar16 = dVar16 * 1000.0;
              }
              dVar22 = 1.0;
              if (1.0 <= dVar16) {
                dVar22 = dVar16;
              }
              *(double *)((long)kinmem + 0x78) = dVar22;
              if (*(int *)((long)kinmem + 0x240) == 0) {
                *(undefined4 *)((long)kinmem + 0x68) = 0;
              }
              else {
                bVar15 = *(int *)((long)kinmem + 0x58) != 3;
                u_scale = (N_Vector)(ulong)bVar15;
                *(uint *)((long)kinmem + 0x68) = (uint)bVar15;
                if (bVar15) {
                  if (*(int *)((long)kinmem + 0x58) == 1) {
                    *(undefined8 *)((long)kinmem + 0xb8) = 0x3ff9e3779b97f4a8;
                  }
                  *(undefined8 *)((long)kinmem + 0xa8) = 0x3fe0000000000000;
                }
                *(undefined4 *)((long)kinmem + 0x6c) = 1;
              }
              *(undefined8 *)((long)kinmem + 0xf0) = 0;
              *(undefined8 *)((long)kinmem + 0xf8) = 0;
              *(undefined8 *)((long)kinmem + 0xe0) = 0;
              *(undefined8 *)((long)kinmem + 0xe8) = 0;
              *(undefined8 *)((long)kinmem + 0xd0) = 0;
              *(undefined8 *)((long)kinmem + 0xd8) = 0;
              iVar5 = (**(code **)((long)kinmem + 0x10))
                                (*(undefined8 *)((long)kinmem + 0x108),
                                 *(undefined8 *)((long)kinmem + 0x118),
                                 *(undefined8 *)((long)kinmem + 0x18));
              *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
              if (iVar5 < 0) {
                pcVar9 = "KINSolInit";
                pcVar13 = "The system function failed in an unrecoverable manner.";
                uVar8 = 0xfffffff3;
                iVar5 = 0x629;
              }
              else if (iVar5 == 0) {
                pKVar12 = (KINMem)kinmem;
                sVar17 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                                    *(N_Vector *)((long)kinmem + 0x130));
                if (sVar17 <= *(double *)((long)kinmem + 0x20) * 0.01) {
                  uVar11 = N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                      *(undefined8 *)((long)kinmem + 0x130));
                  *(undefined8 *)((long)kinmem + 0x250) = uVar11;
                  return 1;
                }
                KINPrintInfo(pKVar12,4,module_02,(char *)u_scale,
                             "scaled f norm (for stopping) = %12.3lg");
                if ((*(code **)((long)kinmem + 0x220) == (code *)0x0) ||
                   (iVar5 = (**(code **)((long)kinmem + 0x220))(kinmem), iVar5 == 0)) {
                  pKVar12 = *(KINMem *)((long)kinmem + 0x118);
                  dVar16 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)((long)kinmem + 0x130));
                  *(double *)((long)kinmem + 0x250) = dVar16;
                  *(double *)((long)kinmem + 600) = dVar16 * 0.5 * dVar16;
                  *(double *)((long)kinmem + 0x270) = dVar16;
                  R = *(sunrealtype **)((long)kinmem + 0xd8);
                  KINPrintInfo(pKVar12,2,module_03,(char *)u_scale,
                               "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                               *(undefined8 *)((long)kinmem + 0xd0),R);
                  *(undefined8 *)((long)kinmem + 0x100) = 0;
                  *(undefined8 *)((long)kinmem + 200) =
                       *(undefined8 *)
                        (&DAT_001190c0 + (ulong)(*(int *)((long)kinmem + 0xc0) == 0) * 8);
                  iVar5 = *(int *)((long)kinmem + 0x240);
                  dVar16 = 0.0;
                  if ((iVar5 != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
                    dVar16 = *(double *)((long)kinmem + 0x20) * 0.01;
                  }
                  uVar8 = -(uint)(*(double *)((long)kinmem + 0x280) == 0.0) & 1;
                  pcVar9 = (char *)(ulong)uVar8;
                  *(uint *)((long)kinmem + 0x278) = uVar8;
                  if (*(int *)((long)kinmem + 0x30) != 2) {
                    bVar15 = false;
                    local_100 = -1.0;
                    dVar22 = -1.0;
                    uVar14 = 0;
LAB_0010a977:
                    *(undefined4 *)((long)kinmem + 0x70) = 0;
                    *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
                    if (*(int *)((long)kinmem + 0x240) != 0) {
                      dVar18 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                               *(double *)((long)kinmem + 0x250);
                      *(double *)((long)kinmem + 0xa0) = dVar18;
                      if (*(int *)((long)kinmem + 0x5c) == 0) {
                        dVar20 = dVar16;
                        if (dVar16 <= dVar18) {
                          dVar20 = dVar18;
                        }
                        *(double *)((long)kinmem + 0xa0) = dVar20;
                      }
                    }
LAB_0010a9c3:
                    pKVar12 = (KINMem)kinmem;
                    if (*(int *)((long)kinmem + 0x30) == 1) {
                      uVar8 = KINLinSolDrv((KINMem)kinmem);
                      pcVar13 = extraout_RDX_18;
                      if (uVar8 == 0) {
                        pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                        local_d8 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)((long)kinmem + 0x128))
                        ;
                        dVar18 = *(double *)((long)kinmem + 0x78) / local_d8;
                        *(double *)((long)kinmem + 0x90) = local_d8;
                        if (local_d8 <= *(double *)((long)kinmem + 0x78)) {
                          local_f8 = 1.0;
                          pcVar13 = extraout_RDX_19;
                          local_c0 = dVar18;
                        }
                        else {
                          pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(dVar18,pKVar12,pKVar12);
                          local_d8 = *(double *)((long)kinmem + 0x78);
                          *(double *)((long)kinmem + 0x90) = local_d8;
                          local_c0 = 1.0;
                          pcVar13 = extraout_RDX_20;
                          local_f8 = dVar18;
                        }
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (pKVar12 = (KINMem)kinmem, iVar5 = KINConstraint((KINMem)kinmem),
                           pcVar13 = extraout_RDX_21, iVar5 != -0x3e4)) {
LAB_0010ace9:
                          iVar5 = 5;
                          while( true ) {
                            bVar15 = iVar5 == 0;
                            iVar5 = iVar5 + -1;
                            if (bVar15) goto LAB_0010bad0;
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar12 = *(KINMem *)((long)kinmem + 0x110);
                            iVar6 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar6 == 0) break;
                            pcVar13 = extraout_RDX_23;
                            if (iVar6 < 0) goto LAB_0010ba94;
                            pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar12,pKVar12);
                            local_f8 = local_f8 * 0.5;
                            local_d8 = local_d8 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_d8;
                            local_c0 = 1.0;
                            pcVar13 = extraout_RDX_24;
                          }
                          local_100 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                                         *(undefined8 *)((long)kinmem + 0x130));
                          dVar19 = *(double *)((long)kinmem + 0x260) * local_f8;
                          pKVar12 = (KINMem)kinmem;
                          sVar17 = KINScSNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x138),
                                              *(N_Vector *)((long)kinmem + 0x108));
                          dVar18 = *(double *)((long)kinmem + 0x28) / sVar17;
                          KINPrintInfo(pKVar12,8,module_09,pcVar9,
                                       "min_lam = %11.4le   f1norm = %11.4le   pnorm = %11.4le",
                                       dVar18,*(undefined8 *)((long)kinmem + 600),SUB84(local_d8,0))
                          ;
                          dVar21 = dVar19 * 0.0001;
                          iVar5 = 0;
                          local_98 = 0.0;
                          local_a8 = 0.0;
                          bVar15 = false;
                          pcVar13 = extraout_RDX_25;
                          dVar20 = 1.0;
                          dVar22 = local_100 * 0.5 * local_100;
                          do {
                            dVar23 = dVar22;
                            local_e8 = dVar20;
                            dVar26 = dVar21 * local_e8 + *(double *)((long)kinmem + 600);
                            KINPrintInfo(pKVar12,9,pcVar13,pcVar9,
                                         "fnorm = %15.8le   f1norm = %15.8le   alpha_cond = %15.8le  lam = %15.8le"
                                        );
                            dVar20 = *(double *)((long)kinmem + 600);
                            if (dVar23 <= dVar26) {
                              dVar19 = dVar19 * 0.9;
                              pcVar13 = extraout_RDX_26;
                              dVar22 = dVar23;
                              if (dVar19 * local_e8 + dVar20 <= dVar23) goto LAB_0010b71e;
                              if ((local_e8 != 1.0) || (NAN(local_e8))) goto LAB_0010b47a;
                              if (local_d8 < *(double *)((long)kinmem + 0x78)) {
                                local_a8 = 1.0;
                                goto LAB_0010b32f;
                              }
                              local_e8 = 1.0;
                              goto LAB_0010b71e;
                            }
                            if (bVar15) {
                              dVar22 = (dVar23 - dVar20) - local_e8 * dVar19;
                              dVar27 = (local_a8 - dVar20) - local_98 * dVar19;
                              dVar26 = 1.0 / (local_e8 - local_98);
                              dVar20 = ((1.0 / (local_e8 * local_e8)) * dVar22 +
                                       (-1.0 / (local_98 * local_98)) * dVar27) * dVar26;
                              dVar26 = dVar26 * ((local_e8 / (local_98 * local_98)) * dVar27 -
                                                (local_98 / (local_e8 * local_e8)) * dVar22);
                              dVar22 = dVar20 * 3.0;
                              if (*(double *)((long)kinmem + 8) <= ABS(dVar20)) {
                                dVar27 = dVar26 * dVar26 - dVar19 * dVar22;
                                dVar20 = 0.0;
                                if (0.0 < dVar27) {
                                  if (dVar27 < 0.0) {
                                    dVar20 = sqrt(dVar27);
                                  }
                                  else {
                                    dVar20 = SQRT(dVar27);
                                  }
                                }
                                dVar22 = (dVar20 - dVar26) / dVar22;
                              }
                              else {
                                dVar22 = -dVar19 / (dVar26 + dVar26);
                              }
                            }
                            else {
                              dVar22 = (dVar23 - dVar20) - dVar19;
                              dVar22 = -dVar19 / (dVar22 + dVar22);
                            }
                            dVar26 = local_e8 * 0.5;
                            if (dVar22 <= local_e8 * 0.5) {
                              dVar26 = dVar22;
                            }
                            dVar20 = local_e8 * 0.1;
                            if (local_e8 * 0.1 <= dVar26) {
                              dVar20 = dVar26;
                            }
                            N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar12 = *(KINMem *)((long)kinmem + 0x110);
                            iVar6 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            pcVar13 = extraout_RDX_27;
                            if (iVar6 != 0) goto LAB_0010ba94;
                            iVar5 = iVar5 + 1;
                            pKVar12 = *(KINMem *)((long)kinmem + 0x118);
                            local_100 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)
                                                                    ((long)kinmem + 0x130));
                            dVar22 = local_100 * 0.5 * local_100;
                            bVar15 = true;
                            pcVar13 = extraout_RDX_28;
                            local_a8 = dVar23;
                            local_98 = local_e8;
                          } while (dVar18 <= dVar20);
                          pKVar12 = *(KINMem *)((long)kinmem + 0x108);
                          N_VScale(0x3ff0000000000000,pKVar12,*(undefined8 *)((long)kinmem + 0x110))
                          ;
                          pcVar13 = extraout_RDX_29;
                        }
                        else {
                          pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(*(undefined8 *)((long)kinmem + 0x98),pKVar12,pKVar12);
                          dVar18 = *(double *)((long)kinmem + 0x98);
                          local_d8 = local_d8 * dVar18;
                          *(double *)((long)kinmem + 0x90) = local_d8;
                          KINPrintInfo(pKVar12,6,module_07,pcVar9,"(ivio=1) pnorm = %12.4le");
                          if (*(double *)((long)kinmem + 0x28) < local_d8) {
                            local_f8 = local_f8 * dVar18;
                            local_c0 = 1.0;
                            pcVar13 = extraout_RDX_22;
                            goto LAB_0010ace9;
                          }
                          pKVar12 = *(KINMem *)((long)kinmem + 0x108);
                          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar12,
                                       *(undefined8 *)((long)kinmem + 0x138),
                                       *(undefined8 *)((long)kinmem + 0x110));
                          pcVar13 = extraout_RDX_30;
                        }
                        iVar5 = -0x3e5;
                        goto LAB_0010b224;
                      }
                    }
                    else {
                      if (*(int *)((long)kinmem + 0x30) != 0) {
LAB_0010b240:
                        iVar5 = 0;
                        goto LAB_0010b242;
                      }
                      uVar8 = KINLinSolDrv((KINMem)kinmem);
                      pcVar13 = extraout_RDX_10;
                      if (uVar8 == 0) {
                        pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                        local_f8 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)((long)kinmem + 0x128))
                        ;
                        local_d8 = 1.0;
                        pcVar13 = extraout_RDX_11;
                        if (*(double *)((long)kinmem + 0x78) < local_f8) {
                          local_d8 = *(double *)((long)kinmem + 0x78) / local_f8;
                          pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(pKVar12,pKVar12);
                          local_f8 = *(double *)((long)kinmem + 0x78);
                          pcVar13 = extraout_RDX_12;
                        }
                        KINPrintInfo(pKVar12,5,pcVar13,pcVar9,"pnorm = %12.4le",local_f8);
                        *(double *)((long)kinmem + 0x90) = local_f8;
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        pcVar13 = extraout_RDX_13;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (pKVar12 = (KINMem)kinmem, iVar5 = KINConstraint((KINMem)kinmem),
                           pcVar13 = extraout_RDX_14, iVar5 != -0x3e4)) {
LAB_0010ab03:
                          iVar5 = 5;
                          while( true ) {
                            bVar15 = iVar5 == 0;
                            iVar5 = iVar5 + -1;
                            if (bVar15) goto LAB_0010bad0;
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar12 = *(KINMem *)((long)kinmem + 0x110);
                            iVar6 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar6 == 0) break;
                            pcVar13 = extraout_RDX_16;
                            if (iVar6 < 0) goto LAB_0010ba94;
                            local_d8 = local_d8 * 0.5;
                            pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar12,pKVar12);
                            local_f8 = local_f8 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_f8;
                            pcVar13 = extraout_RDX_17;
                          }
                          pKVar12 = *(KINMem *)((long)kinmem + 0x118);
                          local_100 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)
                                                                  ((long)kinmem + 0x130));
                          dVar22 = local_100 * 0.5 * local_100;
                          dVar18 = local_d8 * *(double *)((long)kinmem + 0x268);
                          auVar28._8_4_ = SUB84(dVar18,0);
                          auVar28._0_8_ = local_d8 * *(double *)((long)kinmem + 0x260);
                          auVar28._12_4_ = (int)((ulong)dVar18 >> 0x20);
                          *(undefined1 (*) [16])((long)kinmem + 0x260) = auVar28;
                          KINPrintInfo(pKVar12,7,module_08,pcVar9,"fnorm(L2) = %20.8le");
                          uVar14 = 0;
                          if (local_f8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
                            bVar15 = false;
                          }
                          else {
                            bVar15 = true;
                          }
                          goto LAB_0010b240;
                        }
                        dVar18 = *(double *)((long)kinmem + 0x98);
                        pKVar12 = *(KINMem *)((long)kinmem + 0x138);
                        N_VScale(pKVar12,pKVar12);
                        local_f8 = local_f8 * *(double *)((long)kinmem + 0x98);
                        *(double *)((long)kinmem + 0x90) = local_f8;
                        KINPrintInfo(pKVar12,5,module_06,pcVar9,"pnorm = %12.4le");
                        if (*(double *)((long)kinmem + 0x28) < local_f8) {
                          local_d8 = local_d8 * dVar18;
                          pcVar13 = extraout_RDX_15;
                          goto LAB_0010ab03;
                        }
                        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                     *(undefined8 *)((long)kinmem + 0x108),
                                     *(undefined8 *)((long)kinmem + 0x138),
                                     *(undefined8 *)((long)kinmem + 0x110));
                        iVar5 = -0x3e5;
                        bVar15 = false;
                        goto LAB_0010b238;
                      }
                    }
                    goto LAB_0010bb35;
                  }
                  pcVar9 = extraout_RDX_04;
                  if (*(long *)((long)kinmem + 0x120) != 0) {
LAB_0010a5df:
                    p_Var1 = *(N_Vector *)((long)kinmem + 0x148);
                    *(undefined8 *)((long)kinmem + 0xd0) = 0;
                    local_f8 = 0.0;
                    if ((iVar5 != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
                      local_f8 = *(double *)((long)kinmem + 0x20) * 0.01;
                    }
                    uVar11 = 0xfffffc19;
                    x = p_Var1;
                    do {
                      if ((int)uVar11 != -999) {
LAB_0010ba7b:
                        KINPrintInfo(pKVar12,1,pcVar9,(char *)x,"Return value: %d",uVar11,R);
                        return (int)uVar11;
                      }
                      lVar7 = *(long *)((long)kinmem + 0xd0) + 1;
                      *(long *)((long)kinmem + 0xd0) = lVar7;
                      if (*(int *)((long)kinmem + 0x240) != 0) {
                        dVar16 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8))
                                 * *(double *)((long)kinmem + 0x250);
                        *(double *)((long)kinmem + 0xa0) = dVar16;
                        if (*(int *)((long)kinmem + 0x5c) == 0) {
                          dVar22 = local_f8;
                          if (local_f8 <= dVar16) {
                            dVar22 = dVar16;
                          }
                          *(double *)((long)kinmem + 0xa0) = dVar22;
                        }
                      }
                      uVar11 = *(undefined8 *)((long)kinmem + 0x120);
                      uVar2 = *(undefined8 *)((long)kinmem + 0x108);
                      uVar3 = *(undefined8 *)((long)kinmem + 0x118);
                      if (*(long *)((long)kinmem + 0x40) <= lVar7 - *(long *)((long)kinmem + 0xe0))
                      {
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
                        *(undefined4 *)((long)kinmem + 0x74) = 1;
                        *(undefined4 *)((long)kinmem + 100) = 0;
                        goto LAB_0010a6de;
                      }
                      *(undefined4 *)((long)kinmem + 100) = 0;
                      if (1.5 < *(double *)((long)kinmem + 200)) goto LAB_0010a6de;
                      while( true ) {
                        N_VScale(0xbff0000000000000,uVar3,uVar3);
                        x = (N_Vector)((long)kinmem + 0x268);
                        pKVar12 = (KINMem)kinmem;
                        iVar5 = (**(code **)((long)kinmem + 0x230))
                                          (kinmem,uVar11,uVar3,(N_Vector)((long)kinmem + 0x268),
                                           (long)kinmem + 0x260);
                        if (iVar5 == 0) break;
                        pcVar9 = extraout_RDX_06;
                        if (((iVar5 < 0) || (*(long *)((long)kinmem + 0x228) == 0)) ||
                           (*(int *)((long)kinmem + 100) != 0)) goto LAB_0010ba76;
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010a6de:
                        if (*(code **)((long)kinmem + 0x228) != (code *)0x0) {
                          pKVar12 = (KINMem)kinmem;
                          iVar5 = (**(code **)((long)kinmem + 0x228))();
                          *(undefined4 *)((long)kinmem + 100) = 1;
                          x = *(N_Vector *)((long)kinmem + 0xd0);
                          *(N_Vector *)((long)kinmem + 0xe0) = x;
                          *(N_Vector *)((long)kinmem + 0xe8) = x;
                          pcVar9 = extraout_RDX_05;
                          if (iVar5 != 0) goto LAB_0010ba76;
                        }
                      }
                      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,uVar2,uVar11,uVar11);
                      if (*(long *)((long)kinmem + 0x1c0) == 0) {
LAB_0010a7f7:
                        if (*(int *)((long)kinmem + 0x164) == 0) {
                          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x120),
                                   *(undefined8 *)((long)kinmem + 0x110));
                        }
                        else {
                          N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                                       *(undefined8 *)((long)kinmem + 0x108),
                                       *(undefined8 *)((long)kinmem + 0x120),
                                       *(undefined8 *)((long)kinmem + 0x110));
                        }
                      }
                      else {
                        uVar10 = *(ulong *)((long)kinmem + 0x1c8);
                        if (*(long *)((long)kinmem + 0xd0) <= (long)uVar10) goto LAB_0010a7f7;
                        if ((long)uVar10 < 1) {
                          uVar10 = 0;
                        }
                        x = *(N_Vector *)((long)kinmem + 0x110);
                        R = *(sunrealtype **)((long)kinmem + 0x1a8);
                        AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x120),p_Var1,x,
                                    *(N_Vector *)((long)kinmem + 0x108),
                                    *(long *)((long)kinmem + 0xd0) + ~uVar10,R,
                                    *(sunrealtype **)((long)kinmem + 0x1a0));
                      }
                      pKVar12 = *(KINMem *)((long)kinmem + 0x110);
                      iVar5 = (**(code **)((long)kinmem + 0x10))
                                        (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                                         *(undefined8 *)((long)kinmem + 0x18));
                      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                      pcVar9 = extraout_RDX_07;
                      if (iVar5 < 0) {
LAB_0010ba76:
                        uVar11 = 0xfffffff3;
                        goto LAB_0010ba7b;
                      }
                      pKVar12 = (KINMem)kinmem;
                      sVar17 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                                          *(N_Vector *)((long)kinmem + 0x130));
                      *(sunrealtype *)((long)kinmem + 0x250) = sVar17;
                      KINPrintInfo(pKVar12,4,module_04,(char *)x,
                                   "scaled f norm (for stopping) = %12.3lg");
                      R = *(sunrealtype **)((long)kinmem + 0xd8);
                      KINPrintInfo(pKVar12,2,module_05,(char *)x,
                                   "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                                   *(undefined8 *)((long)kinmem + 0x250),
                                   *(undefined8 *)((long)kinmem + 0xd0),R);
                      lVar7 = *(long *)((long)kinmem + 0xd0);
                      lVar4 = *(long *)((long)kinmem + 0x38);
                      uVar11 = 0xfffffffa;
                      if (lVar7 < lVar4) {
                        uVar11 = 0xfffffc19;
                      }
                      bVar15 = *(double *)((long)kinmem + 0x250) <= *(double *)((long)kinmem + 0x20)
                      ;
                      if (bVar15) {
                        uVar11 = 0;
                      }
                      pKVar12 = *(KINMem *)((long)kinmem + 0x110);
                      N_VScale(0x3ff0000000000000,pKVar12,*(undefined8 *)((long)kinmem + 0x108));
                      pcVar9 = extraout_RDX_08;
                      if ((!bVar15 && lVar7 < lVar4) && (*(int *)((long)kinmem + 0x68) != 0)) {
                        sVar17 = (sunrealtype)
                                 N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                            *(undefined8 *)((long)kinmem + 0x130));
                        pKVar12 = (KINMem)kinmem;
                        KINForcingTerm((KINMem)kinmem,sVar17);
                        pcVar9 = extraout_RDX_09;
                      }
                    } while( true );
                  }
                  pKVar12 = *(KINMem *)((long)kinmem + 0x110);
                  auVar28 = N_VClone();
                  pcVar9 = auVar28._8_8_;
                  *(long *)((long)kinmem + 0x120) = auVar28._0_8_;
                  if (auVar28._0_8_ != 0) {
                    *(long *)((long)kinmem + 0x210) =
                         *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
                    *(long *)((long)kinmem + 0x218) =
                         *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
                    iVar5 = *(int *)((long)kinmem + 0x240);
                    goto LAB_0010a5df;
                  }
                  pcVar9 = "KINSol";
                  pcVar13 = "A memory request failed.";
                  uVar8 = 0xfffffffc;
                  iVar5 = 0x25d;
                }
                else {
                  pcVar9 = "KINSolInit";
                  pcVar13 = "The linear solver\'s init routine failed.";
                  uVar8 = 0xfffffff6;
                  iVar5 = 0x646;
                }
              }
              else {
                pcVar9 = "KINSolInit";
                pcVar13 = "The system function failed at the first call.";
                uVar8 = 0xfffffff2;
                iVar5 = 0x62f;
              }
            }
            else if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) {
              pcVar9 = "KINSolInit";
              pcVar13 = "Constraints not allowed with fixed point or Picard iterations";
              uVar8 = 0xfffffffe;
              iVar5 = 0x5ce;
            }
            else {
              *(undefined4 *)((long)kinmem + 0x60) = 1;
              if ((*(long *)((long)pKVar12->kin_uround + 0xe0) == 0) ||
                 (*(long *)((long)pKVar12->kin_uround + 0xe8) == 0)) {
                pcVar9 = "KINSolInit";
                pcVar13 = "A required vector operation is not implemented.";
                uVar8 = 0xfffffffe;
                iVar5 = 0x5df;
              }
              else {
                iVar5 = N_VConstrMask(pKVar12,*(undefined8 *)((long)kinmem + 0x108),
                                      *(undefined8 *)((long)kinmem + 0x148));
                pcVar9 = extraout_RDX_03;
                if (iVar5 != 0) goto LAB_0010a26b;
                pcVar9 = "KINSolInit";
                pcVar13 = "Initial guess does NOT meet constraints.";
                uVar8 = 0xfffffffe;
                iVar5 = 0x5ec;
              }
            }
          }
        }
      }
    }
    else {
      pcVar9 = "KINSolInit";
      pcVar13 = "Illegal value for global strategy.";
      uVar8 = 0xfffffffe;
      iVar5 = 0x5a9;
    }
  }
  goto LAB_0010a24c;
LAB_0010bad0:
  KINPrintInfo(pKVar12,1,pcVar13,pcVar9,"Return value: %d",0xfffffffffffffff1);
  goto switchD_0010bb63_caseD_fffffff1;
  while( true ) {
    iVar5 = iVar5 + 1;
    pKVar12 = *(KINMem *)((long)kinmem + 0x118);
    local_100 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)((long)kinmem + 0x130));
    dVar22 = local_100 * 0.5 * local_100;
    dVar20 = *(double *)((long)kinmem + 600);
    dVar26 = dVar21 * local_e8 + dVar20;
    KINPrintInfo(pKVar12,10,module_10,pcVar9,
                 "f1norm = %15.8le   beta_cond = %15.8le   lam = %15.8le",dVar22);
    bVar15 = dVar19 * local_e8 + dVar20 <= dVar22;
    if ((dVar26 < dVar22 || bVar15) || (local_c0 <= local_a8)) break;
LAB_0010b32f:
    local_98 = local_a8;
    local_a8 = local_a8 + local_a8;
    local_e8 = local_a8;
    if (local_c0 <= local_a8) {
      local_e8 = local_c0;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                 *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
    pKVar12 = *(KINMem *)((long)kinmem + 0x110);
    iVar6 = (**(code **)((long)kinmem + 0x10))
                      (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    pcVar13 = extraout_RDX_31;
    if (iVar6 != 0) goto LAB_0010ba94;
  }
  pcVar13 = extraout_RDX_32;
  if (dVar26 >= dVar22 && !bVar15) {
    local_e8 = local_c0;
  }
LAB_0010b47a:
  if ((local_e8 < 1.0) || ((1.0 < local_e8 && (dVar26 < dVar22)))) {
    uVar24 = SUB84(local_e8,0);
    uVar25 = (undefined4)((ulong)local_e8 >> 0x20);
    if (local_98 <= local_e8) {
      uVar24 = SUB84(local_98,0);
      uVar25 = (undefined4)((ulong)local_98 >> 0x20);
    }
    local_a8 = (double)CONCAT44(uVar25,uVar24);
    local_98 = ABS(local_98 - local_e8);
    do {
      local_c0 = local_98;
      local_98 = local_c0;
      do {
        local_c0 = local_98;
        local_98 = local_c0 * 0.5;
        local_e8 = local_a8 + local_98;
        N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                     *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
        pKVar12 = *(KINMem *)((long)kinmem + 0x110);
        iVar6 = (**(code **)((long)kinmem + 0x10))
                          (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        pcVar13 = extraout_RDX_33;
        if (iVar6 != 0) goto LAB_0010ba94;
        iVar5 = iVar5 + 1;
        pKVar12 = *(KINMem *)((long)kinmem + 0x118);
        local_100 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)((long)kinmem + 0x130));
        dVar22 = local_100 * 0.5 * local_100;
        dVar20 = dVar21 * local_e8 + *(double *)((long)kinmem + 600);
        dVar26 = dVar19 * local_e8 + *(double *)((long)kinmem + 600);
        KINPrintInfo(pKVar12,0xb,module_11,pcVar9,
                     "f1norm = %15.8le  alpha_cond = %15.8le  beta_cond = %15.8le  lam = %15.8le",
                     dVar22,dVar20);
      } while (dVar20 < dVar22);
      if (dVar26 <= dVar22) break;
      local_98 = local_c0 - local_98;
      local_a8 = (double)(~-(ulong)(dVar22 < dVar26) & (ulong)local_a8 |
                         -(ulong)(dVar22 < dVar26) & (ulong)local_e8);
    } while (dVar18 <= local_98);
    pcVar13 = extraout_RDX_34;
    if (dVar22 < dVar26) {
      N_VLinearSum(0x3ff0000000000000,local_e8,*(undefined8 *)((long)kinmem + 0x108),
                   *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
      pKVar12 = *(KINMem *)((long)kinmem + 0x110);
      iVar6 = (**(code **)((long)kinmem + 0x10))
                        (pKVar12,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      pcVar13 = extraout_RDX_35;
      if (iVar6 != 0) {
LAB_0010ba94:
        KINPrintInfo(pKVar12,1,pcVar13,pcVar9,"Return value: %d",0xfffffffffffffff3);
        goto switchD_0010bb63_caseD_fffffff3;
      }
      pKVar12 = *(KINMem *)((long)kinmem + 0x118);
      local_100 = (double)N_VWL2Norm(pKVar12,*(undefined8 *)((long)kinmem + 0x130));
      *(long *)((long)kinmem + 0xf0) = *(long *)((long)kinmem + 0xf0) + 1;
      pcVar13 = extraout_RDX_36;
      dVar22 = local_100 * 0.5 * local_100;
    }
  }
LAB_0010b71e:
  *(long *)((long)kinmem + 0xf8) = *(long *)((long)kinmem + 0xf8) + (long)iVar5;
  iVar5 = 0;
  KINPrintInfo(pKVar12,0xc,pcVar13,pcVar9,"no. of lambda adjustments = %ld");
  *(double *)((long)kinmem + 0x260) = local_f8 * local_e8 * *(double *)((long)kinmem + 0x260);
  *(double *)((long)kinmem + 0x268) = local_f8 * local_e8 * *(double *)((long)kinmem + 0x268);
  pcVar13 = extraout_RDX_37;
  if (local_d8 * local_e8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
LAB_0010b224:
    bVar15 = false;
  }
  else {
    bVar15 = true;
  }
  if (*(long *)((long)kinmem + 0x50) < *(long *)((long)kinmem + 0xf0)) {
    KINPrintInfo(pKVar12,1,pcVar13,pcVar9,"Return value: %d",0xfffffffffffffff8);
    goto switchD_0010bb63_caseD_fffffff8;
  }
LAB_0010b238:
  uVar14 = 0;
LAB_0010b242:
  uVar8 = uVar14;
  if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) goto LAB_0010b8a8;
  if (*(int *)((long)kinmem + 0x68) != 0) {
    KINForcingTerm((KINMem)kinmem,local_100);
  }
  *(double *)((long)kinmem + 0x250) = local_100;
  if (iVar5 == -0x3e5) {
    if ((*(long *)((long)kinmem + 0x228) == 0) || (*(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b791;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
    *(undefined4 *)((long)kinmem + 0x70) = 1;
    uVar14 = 0xfffffc1a;
    goto LAB_0010a9c3;
  }
  pKVar12 = (KINMem)kinmem;
  sVar17 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                      *(N_Vector *)((long)kinmem + 0x130));
  KINPrintInfo(pKVar12,4,module_12,pcVar9,"scaled f norm (for stopping) = %12.3lg");
  uVar8 = 0;
  if (sVar17 <= *(double *)((long)kinmem + 0x20)) goto LAB_0010b8a8;
  p_Var1 = *(N_Vector *)((long)kinmem + 0x138);
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
               *(undefined8 *)((long)kinmem + 0x108),p_Var1);
  sVar17 = KINScSNorm((KINMem)kinmem,p_Var1,*(N_Vector *)((long)kinmem + 0x110));
  if (sVar17 <= *(double *)((long)kinmem + 0x28)) {
    uVar8 = 2;
    if ((*(long *)((long)kinmem + 0x228) == 0) || (uVar8 = 2, *(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b8a8;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010b8a2:
    uVar8 = 0xfffffc19;
    goto LAB_0010b8a8;
  }
  lVar7 = *(long *)((long)kinmem + 0xd0);
  uVar8 = 0xfffffffa;
  if (*(long *)((long)kinmem + 0x38) <= lVar7) goto LAB_0010b8a8;
  if (bVar15) {
    pcVar9 = (char *)(*(long *)((long)kinmem + 0x100) + 1);
    *(char **)((long)kinmem + 0x100) = pcVar9;
    uVar8 = 0xfffffff9;
    if (pcVar9 == (char *)0x5) goto LAB_0010b8a8;
  }
  else {
    *(undefined8 *)((long)kinmem + 0x100) = 0;
  }
  if (*(int *)((long)kinmem + 0x240) != 0) {
    *(sunrealtype *)((long)kinmem + 200) = sVar17;
    goto LAB_0010b8a2;
  }
  uVar8 = 0xfffffc19;
  if (*(int *)((long)kinmem + 0x6c) != 0) goto LAB_0010b8a8;
  pcVar9 = (char *)(lVar7 - *(long *)((long)kinmem + 0xe8));
  if ((long)pcVar9 < *(long *)((long)kinmem + 0x48)) {
    if (*(int *)((long)kinmem + 0x70) == 0) {
      if (*(int *)((long)kinmem + 0x74) != 0) {
        *(undefined8 *)((long)kinmem + 0x270) = *(undefined8 *)((long)kinmem + 0x250);
        goto LAB_0010b9b3;
      }
    }
    else {
      *(undefined8 *)((long)kinmem + 0x270) = *(undefined8 *)((long)kinmem + 0x250);
      if (*(int *)((long)kinmem + 0x74) != 0) {
LAB_0010b9b3:
        *(undefined4 *)((long)kinmem + 0x74) = 0;
      }
    }
  }
  else {
    *(long *)((long)kinmem + 0xe8) = lVar7;
    if (*(int *)((long)kinmem + 0x278) == 0) {
      dVar18 = *(double *)((long)kinmem + 0x280);
    }
    else {
      dVar18 = *(double *)((long)kinmem + 0x250) / *(double *)((long)kinmem + 0x20) + -1.0;
      dVar20 = 0.0;
      if (0.0 <= dVar18) {
        dVar20 = dVar18;
      }
      if (dVar20 <= 12.0) {
        dVar19 = *(double *)((long)kinmem + 0x288);
        dVar21 = exp(dVar20);
        dVar18 = *(double *)((long)kinmem + 0x290);
        if (dVar21 * dVar19 < dVar18) {
          dVar19 = *(double *)((long)kinmem + 0x288);
          dVar18 = exp(dVar20);
          dVar18 = dVar18 * dVar19;
        }
      }
      else {
        dVar18 = *(double *)((long)kinmem + 0x290);
      }
      *(double *)((long)kinmem + 0x280) = dVar18;
    }
    if (dVar18 * *(double *)((long)kinmem + 0x270) < *(double *)((long)kinmem + 0x250)) {
      if ((*(long *)((long)kinmem + 0x228) == 0) || (*(int *)((long)kinmem + 100) != 0))
      goto LAB_0010b8a8;
      uVar11 = 0x4000000000000000;
      goto LAB_0010ba6a;
    }
    *(double *)((long)kinmem + 0x270) = *(double *)((long)kinmem + 0x250);
  }
  uVar11 = 0x3ff0000000000000;
LAB_0010ba6a:
  *(undefined8 *)((long)kinmem + 200) = uVar11;
  goto LAB_0010b8a8;
LAB_0010b791:
  uVar8 = 0xfffffffb;
  if (*(int *)((long)kinmem + 0x30) == 0) {
    uVar8 = 2;
  }
LAB_0010b8a8:
  pKVar12 = *(KINMem *)((long)kinmem + 0x110);
  N_VScale(0x3ff0000000000000,pKVar12,*(undefined8 *)((long)kinmem + 0x108));
  *(double *)((long)kinmem + 600) = dVar22;
  R = *(sunrealtype **)((long)kinmem + 0xd8);
  KINPrintInfo(pKVar12,2,module_13,pcVar9,"nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
               *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),R);
  uVar14 = 0xfffffc19;
  pcVar13 = extraout_RDX_38;
  if (uVar8 != 0xfffffc19) goto LAB_0010bb35;
  goto LAB_0010a977;
LAB_0010bb35:
  KINPrintInfo(pKVar12,1,pcVar13,pcVar9,"Return value: %d",(ulong)uVar8,R);
  switch(uVar8) {
  case 0xfffffff1:
switchD_0010bb63_caseD_fffffff1:
    pcVar9 = "KINSol";
    pcVar13 = "Unable to correct repeated recoverable system function errors.";
    uVar8 = 0xfffffff1;
    iVar5 = 0x2db;
    break;
  default:
    goto switchD_0010bb63_caseD_fffffff2;
  case 0xfffffff3:
switchD_0010bb63_caseD_fffffff3:
    pcVar9 = "The system function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff3;
    iVar5 = 0x2d7;
    goto LAB_0010a1fb;
  case 0xfffffff4:
    pcVar9 = "KINSol";
    pcVar13 = "The linear solver\'s solve function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff4;
    iVar5 = 0x2e3;
    break;
  case 0xfffffff5:
    pcVar9 = "KINSol";
    pcVar13 = "The linear solver\'s setup function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff5;
    iVar5 = 0x2df;
    break;
  case 0xfffffff7:
    pcVar9 = "KINSol";
    pcVar13 = 
    "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
    ;
    uVar8 = 0xfffffff7;
    iVar5 = 0x2e7;
    break;
  case 0xfffffff8:
switchD_0010bb63_caseD_fffffff8:
    pcVar9 = "KINSol";
    pcVar13 = 
    "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations.";
    uVar8 = 0xfffffff8;
    iVar5 = 0x2ef;
    break;
  case 0xfffffff9:
    pcVar9 = "KINSol";
    pcVar13 = "Five consecutive steps have been taken that satisfy a scaled step length test.";
    uVar8 = 0xfffffff9;
    iVar5 = 0x2f7;
    break;
  case 0xfffffffa:
    pcVar9 = "KINSol";
    pcVar13 = "The maximum number of iterations was reached before convergence.";
    uVar8 = 0xfffffffa;
    iVar5 = 0x2f3;
    break;
  case 0xfffffffb:
    pcVar9 = 
    "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
    ;
    uVar8 = 0xfffffffb;
    iVar5 = 0x2eb;
LAB_0010a1fb:
    KINProcessError((KINMem)kinmem,uVar8,iVar5,"KINSol",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                    ,pcVar9);
    goto switchD_0010bb63_caseD_fffffff2;
  }
LAB_0010a24c:
  KINProcessError((KINMem)kinmem,uVar8,iVar5,pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                  ,pcVar13);
switchD_0010bb63_caseD_fffffff2:
  return uVar8;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* intialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", "KINSol", INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", "KINSol", INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", "KINSol", INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}